

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ushort uVar1;
  int *piVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  int16_t iVar33;
  short sVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar69;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar70 [16];
  short sVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar78;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar79 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i vMaxH;
  short local_178;
  short sStack_176;
  undefined1 local_168 [16];
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  parasail_result_t *local_110;
  undefined1 local_108 [16];
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  long local_b8;
  int *local_b0;
  ulong local_a8;
  ulong local_a0;
  int *local_98;
  int *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  short sVar61;
  short sVar64;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_sse2_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_sse2_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_sse2_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_sse2_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_table_diag_sse2_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_table_diag_sse2_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar43 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_table_diag_sse2_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar43 = (ulong)(uint)matrix->length;
    }
    iVar15 = -open;
    iVar18 = matrix->min;
    iVar21 = -iVar18;
    if (iVar18 != iVar15 && SBORROW4(iVar18,iVar15) == iVar18 + open < 0) {
      iVar21 = open;
    }
    uVar24 = iVar21 - 0x7fff;
    iVar18 = matrix->max;
    auVar48 = pshuflw(ZEXT416(uVar24),ZEXT416(uVar24),0);
    uVar47 = auVar48._0_4_;
    local_c8._4_4_ = uVar47;
    local_c8._0_4_ = uVar47;
    local_c8._8_4_ = uVar47;
    local_c8._12_4_ = uVar47;
    local_168._4_4_ = uVar47;
    local_168._0_4_ = uVar47;
    local_168._8_4_ = uVar47;
    local_168._12_4_ = uVar47;
    local_178 = auVar48._0_2_;
    sStack_176 = auVar48._2_2_;
    local_108._4_4_ = uVar47;
    local_108._0_4_ = uVar47;
    local_108._8_4_ = uVar47;
    local_108._12_4_ = uVar47;
    uVar40 = (uint)uVar43;
    ppVar19 = parasail_result_new_table1(uVar40,s2Len);
    if (ppVar19 != (parasail_result_t *)0x0) {
      ppVar19->flag = ppVar19->flag | 0x8221004;
      uVar45 = (ulong)(s2Len + 0xe);
      ptr = parasail_memalign_int16_t(0x10,uVar45);
      ptr_00 = parasail_memalign_int16_t(0x10,uVar45);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar45);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
        if (matrix->type == 0) {
          iVar21 = uVar40 + 7;
          ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar21);
          if (ptr_02 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar40) {
            piVar7 = matrix->mapper;
            uVar45 = 0;
            do {
              ptr_02[uVar45] = (int16_t)piVar7[(byte)_s1[uVar45]];
              uVar45 = uVar45 + 1;
            } while (uVar43 != uVar45);
          }
          iVar16 = uVar40 + 1;
          if ((int)(uVar40 + 1) < iVar21) {
            iVar16 = iVar21;
          }
          memset(ptr_02 + (int)uVar40,0,(ulong)(~uVar40 + iVar16) * 2 + 2);
        }
        else {
          ptr_02 = (int16_t *)0x0;
        }
        uVar35 = s2Len + 7;
        auVar48 = ZEXT416(CONCAT22((short)((uint)iVar15 >> 0x10),0x7ffe - (short)iVar18));
        auVar48 = pshuflw(auVar48,auVar48,0);
        local_f8 = auVar48._0_2_;
        sStack_f6 = auVar48._2_2_;
        uStack_6c = uVar47 & 0xffff;
        auVar48 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
        local_48 = auVar48._0_4_;
        auVar48 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
        local_58 = auVar48._0_4_;
        auVar48 = pshuflw(ZEXT416(uVar40),ZEXT416(uVar40),0);
        local_88 = auVar48._0_4_;
        auVar48 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        local_68 = auVar48._0_4_;
        piVar7 = matrix->mapper;
        uVar45 = 1;
        if (1 < s2Len) {
          uVar45 = (ulong)(uint)s2Len;
        }
        uVar22 = 0;
        do {
          ptr[uVar22 + 7] = (int16_t)piVar7[(byte)_s2[uVar22]];
          uVar22 = uVar22 + 1;
        } while (uVar45 != uVar22);
        uVar22 = 0;
        ptr[3] = 0;
        ptr[4] = 0;
        ptr[5] = 0;
        ptr[6] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        ptr[2] = 0;
        ptr[3] = 0;
        uVar42 = (ulong)(uint)s2Len;
        uVar17 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar35) {
          uVar17 = uVar35;
        }
        local_110 = ppVar19;
        sStack_f4 = local_f8;
        sStack_f2 = sStack_f6;
        sStack_f0 = local_f8;
        sStack_ee = sStack_f6;
        sStack_ec = local_f8;
        sStack_ea = sStack_f6;
        uStack_84 = local_88;
        uStack_80 = local_88;
        uStack_7c = local_88;
        local_78 = uVar47;
        uStack_74 = uVar47;
        uStack_70 = uVar47;
        uStack_64 = local_68;
        uStack_60 = local_68;
        uStack_5c = local_68;
        uStack_54 = local_58;
        uStack_50 = local_58;
        uStack_4c = local_58;
        uStack_44 = local_48;
        uStack_40 = local_48;
        uStack_3c = local_48;
        memset(ptr + uVar42 + 7,0,(ulong)(~s2Len + uVar17) * 2 + 2);
        ppVar19 = local_110;
        do {
          ptr_00[uVar22 + 7] = 0;
          iVar33 = (int16_t)uVar24;
          ptr_01[uVar22 + 7] = iVar33;
          uVar22 = uVar22 + 1;
        } while (uVar45 != uVar22);
        lVar20 = 0;
        do {
          ptr_00[lVar20] = iVar33;
          ptr_01[lVar20] = iVar33;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 7);
        lVar20 = uVar42 + 7;
        do {
          ptr_00[lVar20] = iVar33;
          ptr_01[lVar20] = iVar33;
          lVar20 = lVar20 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar35);
        sVar69 = local_178;
        sVar61 = sStack_176;
        sVar64 = local_178;
        sVar71 = sStack_176;
        sVar72 = local_178;
        sVar73 = sStack_176;
        sVar74 = local_178;
        sVar75 = sStack_176;
        sVar53 = local_f8;
        sVar54 = sStack_f6;
        sVar55 = sStack_f4;
        sVar56 = sStack_f2;
        sVar57 = sStack_f0;
        sVar58 = sStack_ee;
        sVar59 = sStack_ec;
        sVar60 = sStack_ea;
        if (0 < (int)uVar40) {
          local_b0 = matrix->matrix;
          uVar40 = uVar40 - 1;
          local_a0 = 1;
          if (1 < (int)uVar35) {
            local_a0 = (ulong)uVar35;
          }
          local_b8 = uVar42 * 0x20;
          local_118 = uVar42 * 4 + -4;
          local_128 = uVar42 * 0x1c + -0x1c;
          local_130 = uVar42 * 0x18 + -0x18;
          local_138 = uVar42 * 0x14 + -0x14;
          local_140 = uVar42 * 8 + -8;
          local_148 = uVar42 * 0x10 + -0x10;
          local_150 = uVar42 * 0xc + -0xc;
          local_120 = 0;
          uVar45 = 0;
          local_e8 = CONCAT26(sStack_f2,CONCAT24(sStack_f4,CONCAT22(sStack_f6,local_f8)));
          uStack_e0 = CONCAT26(sStack_ea,CONCAT24(sStack_ec,CONCAT22(sStack_ee,sStack_f0)));
          local_d8 = CONCAT26(sStack_176,CONCAT24(local_178,uVar47));
          uStack_d0 = CONCAT26(sStack_176,CONCAT24(local_178,uVar47));
          auVar48 = _DAT_008d09b0;
          do {
            iVar18 = matrix->type;
            uVar17 = (uint)uVar45;
            uVar35 = uVar17;
            if (iVar18 == 0) {
              uVar35 = (uint)ptr_02[uVar45];
            }
            uVar22 = uVar45 | 1;
            if (iVar18 == 0) {
              uVar31 = (int)ptr_02[uVar22];
            }
            else {
              uVar31 = uVar40;
              if (uVar22 < uVar43) {
                uVar31 = uVar17 | 1;
              }
            }
            uVar38 = uVar45 | 2;
            if (iVar18 == 0) {
              uVar36 = (int)ptr_02[uVar38];
            }
            else {
              uVar36 = uVar40;
              if (uVar38 < uVar43) {
                uVar36 = uVar17 | 2;
              }
            }
            uVar46 = uVar45 | 3;
            if (iVar18 == 0) {
              uVar37 = (int)ptr_02[uVar46];
            }
            else {
              uVar37 = uVar40;
              if (uVar46 < uVar43) {
                uVar37 = uVar17 | 3;
              }
            }
            uVar27 = uVar45 | 4;
            if (iVar18 == 0) {
              uVar44 = (int)ptr_02[uVar27];
            }
            else {
              uVar44 = uVar40;
              if (uVar27 < uVar43) {
                uVar44 = uVar17 | 4;
              }
            }
            uVar28 = uVar45 | 5;
            if (iVar18 == 0) {
              uVar26 = (int)ptr_02[uVar28];
            }
            else {
              uVar26 = uVar40;
              if (uVar28 < uVar43) {
                uVar26 = uVar17 | 5;
              }
            }
            uVar23 = uVar45 | 6;
            if (iVar18 == 0) {
              uVar41 = (int)ptr_02[uVar23];
            }
            else {
              uVar41 = uVar40;
              if (uVar23 < uVar43) {
                uVar41 = uVar17 | 6;
              }
            }
            iVar21 = matrix->size;
            local_a8 = uVar45;
            uVar25 = uVar45 | 7;
            if (iVar18 == 0) {
              uVar39 = (int)ptr_02[uVar25];
            }
            else {
              uVar39 = uVar40;
              if (uVar25 < uVar43) {
                uVar39 = uVar17 | 7;
              }
            }
            local_90 = local_b0 + (int)(uVar31 * iVar21);
            local_98 = local_b0 + (int)(uVar36 * iVar21);
            auVar67._0_2_ = -(ushort)(auVar48._0_2_ < (short)local_88);
            auVar67._2_2_ = -(ushort)(auVar48._2_2_ < local_88._2_2_);
            auVar67._4_2_ = -(ushort)(auVar48._4_2_ < (short)uStack_84);
            auVar67._6_2_ = -(ushort)(auVar48._6_2_ < uStack_84._2_2_);
            auVar67._8_2_ = -(ushort)(auVar48._8_2_ < (short)uStack_80);
            auVar67._10_2_ = -(ushort)(auVar48._10_2_ < uStack_80._2_2_);
            auVar67._12_2_ = -(ushort)(auVar48._12_2_ < (short)uStack_7c);
            auVar67._14_2_ = -(ushort)(auVar48._14_2_ < uStack_7c._2_2_);
            uVar29 = 0;
            auVar70._4_2_ = local_178;
            auVar70._0_4_ = uVar47;
            auVar70._6_2_ = sStack_176;
            auVar70._8_2_ = local_178;
            auVar70._10_2_ = sStack_176;
            auVar70._12_2_ = local_178;
            auVar70._14_2_ = sStack_176;
            auVar76._4_4_ = uStack_74;
            auVar76._0_4_ = local_78;
            auVar76._8_4_ = uStack_70;
            auVar76._12_4_ = uStack_6c;
            auVar68 = _DAT_008d0b70;
            auVar77 = auVar76;
            auVar89 = auVar70;
            do {
              auVar49._14_2_ = (short)local_b0[(long)(int)(uVar35 * iVar21) + (long)ptr[uVar29 + 7]]
              ;
              auVar49._12_2_ = (short)(local_b0 + (int)(uVar31 * iVar21))[ptr[uVar29 + 6]];
              auVar49._10_2_ = (short)(local_b0 + (int)(uVar36 * iVar21))[ptr[uVar29 + 5]];
              auVar49._8_2_ = (short)local_b0[(long)(int)(uVar37 * iVar21) + (long)ptr[uVar29 + 4]];
              auVar49._6_2_ = (short)local_b0[(long)(int)(uVar44 * iVar21) + (long)ptr[uVar29 + 3]];
              auVar49._4_2_ = (short)local_b0[(long)(int)(uVar26 * iVar21) + (long)ptr[uVar29 + 2]];
              auVar49._0_2_ = (undefined2)local_b0[(long)(int)(uVar39 * iVar21) + (long)ptr[uVar29]]
              ;
              auVar49._2_2_ = (short)local_b0[(long)(int)(uVar41 * iVar21) + (long)ptr[uVar29 + 1]];
              auVar65 = paddsw(auVar49,auVar77);
              auVar77._0_8_ = auVar76._2_8_;
              auVar77._8_8_ = auVar76._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar29 + 7] << 0x30;
              auVar87._0_8_ = auVar89._2_8_;
              auVar87._8_8_ = auVar89._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar29 + 7] << 0x30;
              auVar63._4_4_ = uStack_44;
              auVar63._0_4_ = local_48;
              auVar63._8_4_ = uStack_40;
              auVar63._12_4_ = uStack_3c;
              auVar49 = psubsw(auVar77,auVar63);
              auVar89._4_4_ = uStack_54;
              auVar89._0_4_ = local_58;
              auVar89._8_4_ = uStack_50;
              auVar89._12_4_ = uStack_4c;
              auVar88 = psubsw(auVar87,auVar89);
              sVar69 = auVar49._0_2_;
              sVar61 = auVar88._0_2_;
              auVar62._0_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar49._2_2_;
              sVar61 = auVar88._2_2_;
              auVar62._2_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar49._4_2_;
              sVar61 = auVar88._4_2_;
              auVar62._4_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar49._6_2_;
              sVar61 = auVar88._6_2_;
              auVar62._6_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar49._8_2_;
              sVar61 = auVar88._8_2_;
              auVar62._8_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar49._10_2_;
              sVar61 = auVar88._10_2_;
              auVar62._10_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar49._12_2_;
              sVar61 = auVar88._12_2_;
              sVar64 = auVar88._14_2_;
              auVar62._12_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar49._14_2_;
              auVar62._14_2_ =
                   (ushort)(sVar64 < sVar69) * sVar69 | (ushort)(sVar64 >= sVar69) * sVar64;
              auVar76 = psubsw(auVar76,auVar63);
              auVar70 = psubsw(auVar70,auVar89);
              sVar69 = auVar76._0_2_;
              sVar61 = auVar70._0_2_;
              auVar88._0_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar76._2_2_;
              sVar61 = auVar70._2_2_;
              auVar88._2_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar76._4_2_;
              sVar61 = auVar70._4_2_;
              auVar88._4_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar76._6_2_;
              sVar61 = auVar70._6_2_;
              auVar88._6_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar76._8_2_;
              sVar61 = auVar70._8_2_;
              auVar88._8_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar76._10_2_;
              sVar61 = auVar70._10_2_;
              auVar88._10_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar76._12_2_;
              sVar61 = auVar70._12_2_;
              sVar64 = auVar70._14_2_;
              auVar88._12_2_ =
                   (ushort)(sVar61 < sVar69) * sVar69 | (ushort)(sVar61 >= sVar69) * sVar61;
              sVar69 = auVar76._14_2_;
              auVar88._14_2_ =
                   (ushort)(sVar64 < sVar69) * sVar69 | (ushort)(sVar64 >= sVar69) * sVar64;
              uVar78 = ((short)auVar88._0_2_ < (short)auVar62._0_2_) * auVar62._0_2_ |
                       ((short)auVar88._0_2_ >= (short)auVar62._0_2_) * auVar88._0_2_;
              uVar80 = ((short)auVar88._2_2_ < (short)auVar62._2_2_) * auVar62._2_2_ |
                       ((short)auVar88._2_2_ >= (short)auVar62._2_2_) * auVar88._2_2_;
              uVar81 = ((short)auVar88._4_2_ < (short)auVar62._4_2_) * auVar62._4_2_ |
                       ((short)auVar88._4_2_ >= (short)auVar62._4_2_) * auVar88._4_2_;
              uVar82 = ((short)auVar88._6_2_ < (short)auVar62._6_2_) * auVar62._6_2_ |
                       ((short)auVar88._6_2_ >= (short)auVar62._6_2_) * auVar88._6_2_;
              uVar83 = ((short)auVar88._8_2_ < (short)auVar62._8_2_) * auVar62._8_2_ |
                       ((short)auVar88._8_2_ >= (short)auVar62._8_2_) * auVar88._8_2_;
              uVar84 = ((short)auVar88._10_2_ < (short)auVar62._10_2_) * auVar62._10_2_ |
                       ((short)auVar88._10_2_ >= (short)auVar62._10_2_) * auVar88._10_2_;
              uVar85 = ((short)auVar88._12_2_ < (short)auVar62._12_2_) * auVar62._12_2_ |
                       ((short)auVar88._12_2_ >= (short)auVar62._12_2_) * auVar88._12_2_;
              uVar86 = ((short)auVar88._14_2_ < (short)auVar62._14_2_) * auVar62._14_2_ |
                       ((short)auVar88._14_2_ >= (short)auVar62._14_2_) * auVar88._14_2_;
              sVar61 = (-1 < (short)uVar78) * uVar78;
              sVar69 = (-1 < (short)uVar80) * uVar80;
              sVar64 = (-1 < (short)uVar81) * uVar81;
              sVar71 = (-1 < (short)uVar82) * uVar82;
              sVar72 = (-1 < (short)uVar83) * uVar83;
              sVar73 = (-1 < (short)uVar84) * uVar84;
              sVar74 = (-1 < (short)uVar85) * uVar85;
              sVar75 = (-1 < (short)uVar86) * uVar86;
              sVar53 = auVar65._0_2_;
              auVar79._0_2_ =
                   (ushort)(sVar61 < sVar53) * sVar53 | (ushort)(sVar61 >= sVar53) * sVar61;
              sVar61 = auVar65._2_2_;
              auVar79._2_2_ =
                   (ushort)(sVar69 < sVar61) * sVar61 | (ushort)(sVar69 >= sVar61) * sVar69;
              sVar69 = auVar65._4_2_;
              auVar79._4_2_ =
                   (ushort)(sVar64 < sVar69) * sVar69 | (ushort)(sVar64 >= sVar69) * sVar64;
              sVar69 = auVar65._6_2_;
              auVar79._6_2_ =
                   (ushort)(sVar71 < sVar69) * sVar69 | (ushort)(sVar71 >= sVar69) * sVar71;
              sVar69 = auVar65._8_2_;
              auVar79._8_2_ =
                   (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
              sVar69 = auVar65._10_2_;
              auVar79._10_2_ =
                   (ushort)(sVar73 < sVar69) * sVar69 | (ushort)(sVar73 >= sVar69) * sVar73;
              sVar69 = auVar65._12_2_;
              auVar79._12_2_ =
                   (ushort)(sVar74 < sVar69) * sVar69 | (ushort)(sVar74 >= sVar69) * sVar74;
              sVar69 = auVar65._14_2_;
              auVar79._14_2_ =
                   (ushort)(sVar75 < sVar69) * sVar69 | (ushort)(sVar75 >= sVar69) * sVar75;
              sVar69 = auVar68._0_2_;
              auVar65._0_2_ = -(ushort)(sVar69 == -1);
              sVar61 = auVar68._2_2_;
              auVar65._2_2_ = -(ushort)(sVar61 == -1);
              sVar64 = auVar68._4_2_;
              auVar65._4_2_ = -(ushort)(sVar64 == -1);
              sVar71 = auVar68._6_2_;
              auVar65._6_2_ = -(ushort)(sVar71 == -1);
              sVar72 = auVar68._8_2_;
              auVar65._8_2_ = -(ushort)(sVar72 == -1);
              sVar73 = auVar68._10_2_;
              auVar65._10_2_ = -(ushort)(sVar73 == -1);
              sVar74 = auVar68._12_2_;
              sVar75 = auVar68._14_2_;
              auVar65._12_2_ = -(ushort)(sVar74 == -1);
              auVar65._14_2_ = -(ushort)(sVar75 == -1);
              auVar76 = ~auVar65 & auVar79;
              uVar78 = auVar76._0_2_;
              uVar80 = auVar76._2_2_;
              uVar86 = auVar76._14_2_;
              uVar83 = auVar76._8_2_;
              uVar84 = auVar76._10_2_;
              uVar85 = auVar76._12_2_;
              uVar81 = auVar76._4_2_;
              uVar82 = auVar76._6_2_;
              if (7 < uVar29) {
                bVar8 = (short)uVar78 < (short)local_e8;
                uVar1 = (ushort)!bVar8 * (short)local_e8;
                bVar9 = (short)uVar80 < local_e8._2_2_;
                uVar2 = (ushort)!bVar9 * local_e8._2_2_;
                bVar10 = (short)uVar81 < local_e8._4_2_;
                uVar3 = (ushort)!bVar10 * local_e8._4_2_;
                bVar11 = (short)uVar83 < (short)uStack_e0;
                uVar4 = (ushort)!bVar11 * (short)uStack_e0;
                bVar12 = (short)uVar84 < uStack_e0._2_2_;
                uVar5 = (ushort)!bVar12 * uStack_e0._2_2_;
                bVar13 = (short)uVar85 < uStack_e0._4_2_;
                uVar6 = (ushort)!bVar13 * uStack_e0._4_2_;
                local_e8 = CONCAT26(((short)uVar82 < local_e8._6_2_) * uVar82 |
                                    (ushort)((short)uVar82 >= local_e8._6_2_) * local_e8._6_2_,
                                    CONCAT24(bVar10 * uVar81 | uVar3,
                                             CONCAT22(bVar9 * uVar80 | uVar2,bVar8 * uVar78 | uVar1)
                                            ));
                uStack_e0 = CONCAT26(((short)uVar86 < uStack_e0._6_2_) * uVar86 |
                                     (ushort)((short)uVar86 >= uStack_e0._6_2_) * uStack_e0._6_2_,
                                     CONCAT24(bVar13 * uVar85 | uVar6,
                                              CONCAT22(bVar12 * uVar84 | uVar5,
                                                       bVar11 * uVar83 | uVar4)));
                bVar8 = (short)local_d8 < (short)uVar78;
                uVar1 = (ushort)!bVar8 * (short)local_d8;
                bVar9 = local_d8._2_2_ < (short)uVar80;
                uVar2 = (ushort)!bVar9 * local_d8._2_2_;
                bVar10 = local_d8._4_2_ < (short)uVar81;
                uVar3 = (ushort)!bVar10 * local_d8._4_2_;
                bVar11 = (short)uStack_d0 < (short)uVar83;
                uVar4 = (ushort)!bVar11 * (short)uStack_d0;
                bVar12 = uStack_d0._2_2_ < (short)uVar84;
                uVar5 = (ushort)!bVar12 * uStack_d0._2_2_;
                bVar13 = uStack_d0._4_2_ < (short)uVar85;
                uVar6 = (ushort)!bVar13 * uStack_d0._4_2_;
                local_d8 = CONCAT26((local_d8._6_2_ < (short)uVar82) * uVar82 |
                                    (ushort)(local_d8._6_2_ >= (short)uVar82) * local_d8._6_2_,
                                    CONCAT24(bVar10 * uVar81 | uVar3,
                                             CONCAT22(bVar9 * uVar80 | uVar2,bVar8 * uVar78 | uVar1)
                                            ));
                uStack_d0 = CONCAT26((uStack_d0._6_2_ < (short)uVar86) * uVar86 |
                                     (ushort)(uStack_d0._6_2_ >= (short)uVar86) * uStack_d0._6_2_,
                                     CONCAT24(bVar13 * uVar85 | uVar6,
                                              CONCAT22(bVar12 * uVar84 | uVar5,
                                                       bVar11 * uVar83 | uVar4)));
              }
              piVar7 = ((local_110->field_4).rowcols)->score_row;
              if (uVar29 < uVar42) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_120) = (uint)uVar86;
              }
              if (uVar29 - 1 < uVar42 && uVar22 < uVar43) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_118) = (uint)uVar85;
              }
              if ((uVar38 < uVar43) && ((long)(uVar29 - 2) < (long)uVar42 && 1 < uVar29)) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_140) = (uint)uVar84;
              }
              if ((uVar46 < uVar43) && ((long)(uVar29 - 3) < (long)uVar42 && 2 < uVar29)) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_150) = (uint)uVar83;
              }
              if ((uVar27 < uVar43) && ((long)(uVar29 - 4) < (long)uVar42 && 3 < uVar29)) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_148) = (uint)uVar82;
              }
              if ((uVar28 < uVar43) && ((long)(uVar29 - 5) < (long)uVar42 && 4 < uVar29)) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_138) = (uint)uVar81;
              }
              if ((uVar23 < uVar43) && ((long)(uVar29 - 6) < (long)uVar42 && 5 < uVar29)) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_130) = (uint)uVar80;
              }
              if ((uVar25 < uVar43) && ((long)(uVar29 - 7) < (long)uVar42 && 6 < uVar29)) {
                *(uint *)((long)piVar7 + uVar29 * 4 + local_128) = (uint)uVar78;
              }
              auVar14._4_2_ = local_178;
              auVar14._0_4_ = uVar47;
              auVar14._6_2_ = sStack_176;
              auVar14._8_2_ = local_178;
              auVar14._10_2_ = sStack_176;
              auVar14._12_2_ = local_178;
              auVar14._14_2_ = sStack_176;
              auVar89 = ~auVar65 & auVar62 | auVar14 & auVar65;
              auVar70 = ~auVar65 & auVar88 | auVar14 & auVar65;
              ptr_00[uVar29] = uVar78;
              ptr_01[uVar29] = auVar89._0_2_;
              auVar50._0_2_ = -(ushort)(sVar69 < (short)local_68);
              auVar50._2_2_ = -(ushort)(sVar61 < local_68._2_2_);
              auVar50._4_2_ = -(ushort)(sVar64 < (short)uStack_64);
              auVar50._6_2_ = -(ushort)(sVar71 < uStack_64._2_2_);
              auVar50._8_2_ = -(ushort)(sVar72 < (short)uStack_60);
              auVar50._10_2_ = -(ushort)(sVar73 < uStack_60._2_2_);
              auVar50._12_2_ = -(ushort)(sVar74 < (short)uStack_5c);
              auVar50._14_2_ = -(ushort)(sVar75 < uStack_5c._2_2_);
              auVar63 = psraw(auVar68,0xf);
              auVar49 = ~auVar63 & auVar50 & auVar67;
              auVar51._0_2_ = -(ushort)(uVar78 == local_c8._0_2_);
              auVar51._2_2_ = -(ushort)(uVar80 == local_c8._2_2_);
              auVar51._4_2_ = -(ushort)(uVar81 == local_c8._4_2_);
              auVar51._6_2_ = -(ushort)(uVar82 == local_c8._6_2_);
              auVar51._8_2_ = -(ushort)(uVar83 == local_c8._8_2_);
              auVar51._10_2_ = -(ushort)(uVar84 == local_c8._10_2_);
              auVar51._12_2_ = -(ushort)(uVar85 == local_c8._12_2_);
              auVar51._14_2_ = -(ushort)(uVar86 == local_c8._14_2_);
              auVar52._0_2_ = -(ushort)((short)local_c8._0_2_ < (short)uVar78);
              auVar52._2_2_ = -(ushort)((short)local_c8._2_2_ < (short)uVar80);
              auVar52._4_2_ = -(ushort)((short)local_c8._4_2_ < (short)uVar81);
              auVar52._6_2_ = -(ushort)((short)local_c8._6_2_ < (short)uVar82);
              auVar52._8_2_ = -(ushort)((short)local_c8._8_2_ < (short)uVar83);
              auVar52._10_2_ = -(ushort)((short)local_c8._10_2_ < (short)uVar84);
              auVar52._12_2_ = -(ushort)((short)local_c8._12_2_ < (short)uVar85);
              auVar52._14_2_ = -(ushort)((short)local_c8._14_2_ < (short)uVar86);
              auVar66._0_2_ = -(ushort)(sVar69 < local_108._0_2_);
              auVar66._2_2_ = -(ushort)(sVar61 < local_108._2_2_);
              auVar66._4_2_ = -(ushort)(sVar64 < local_108._4_2_);
              auVar66._6_2_ = -(ushort)(sVar71 < local_108._6_2_);
              auVar66._8_2_ = -(ushort)(sVar72 < local_108._8_2_);
              auVar66._10_2_ = -(ushort)(sVar73 < local_108._10_2_);
              auVar66._12_2_ = -(ushort)(sVar74 < local_108._12_2_);
              auVar66._14_2_ = -(ushort)(sVar75 < local_108._14_2_);
              auVar66 = auVar66 & auVar51;
              auVar63 = auVar52 & auVar49;
              local_c8 = auVar79 & auVar63 | ~auVar63 & local_c8;
              auVar63 = auVar49 & auVar66 | ~auVar66 & auVar63;
              local_168 = ~auVar63 & local_168 | auVar48 & auVar63;
              auVar49 = (auVar66 | auVar52) & auVar49;
              local_108 = ~auVar49 & local_108 | auVar68 & auVar49;
              auVar68 = paddsw(auVar68,_DAT_008d0b80);
              uVar29 = uVar29 + 1;
            } while (local_a0 != uVar29);
            auVar48 = paddsw(auVar48,_DAT_008d0b90);
            uVar45 = uVar45 + 8;
            local_120 = local_120 + local_b8;
            local_118 = local_118 + local_b8;
            local_128 = local_128 + local_b8;
            local_130 = local_130 + local_b8;
            local_138 = local_138 + local_b8;
            local_148 = local_148 + local_b8;
            local_150 = local_150 + local_b8;
            local_140 = local_140 + local_b8;
          } while (uVar45 < uVar43);
          sVar69 = (short)local_d8;
          sVar61 = local_d8._2_2_;
          sVar64 = local_d8._4_2_;
          sVar71 = local_d8._6_2_;
          sVar72 = (short)uStack_d0;
          sVar73 = uStack_d0._2_2_;
          sVar74 = uStack_d0._4_2_;
          sVar75 = uStack_d0._6_2_;
          sVar53 = (short)local_e8;
          sVar54 = local_e8._2_2_;
          sVar55 = local_e8._4_2_;
          sVar56 = local_e8._6_2_;
          sVar57 = (short)uStack_e0;
          sVar58 = uStack_e0._2_2_;
          sVar59 = uStack_e0._4_2_;
          sVar60 = uStack_e0._6_2_;
        }
        lVar20 = 0;
        iVar16 = 0;
        iVar18 = 0;
        iVar15 = 0;
        iVar21 = 0;
        do {
          uVar78 = *(ushort *)(local_c8 + lVar20 * 2);
          if ((short)(ushort)uVar24 < (short)uVar78) {
            uVar24 = (uint)uVar78;
            iVar18 = (int)*(short *)(local_168 + lVar20 * 2);
            iVar21 = (int)*(short *)(local_108 + lVar20 * 2);
            iVar15 = (int)*(short *)(local_108 + lVar20 * 2);
            iVar16 = (int)*(short *)(local_168 + lVar20 * 2);
          }
          else if (uVar78 == (ushort)uVar24) {
            iVar30 = (int)*(short *)(local_108 + lVar20 * 2);
            if (iVar30 < iVar21) {
              iVar18 = (int)*(short *)(local_168 + lVar20 * 2);
              iVar21 = iVar30;
              iVar15 = iVar30;
              iVar16 = (int)*(short *)(local_168 + lVar20 * 2);
            }
            else if (iVar21 == iVar30) {
              iVar32 = (int)*(short *)(local_168 + lVar20 * 2);
              iVar21 = iVar15;
              if (iVar32 < iVar18) {
                iVar21 = iVar30;
              }
              bVar8 = iVar32 <= iVar18;
              iVar18 = iVar16;
              iVar15 = iVar21;
              if (bVar8) {
                iVar18 = iVar32;
                iVar16 = iVar32;
              }
            }
          }
          sVar34 = (short)uVar24;
          lVar20 = lVar20 + 1;
        } while ((int)lVar20 != 8);
        auVar48._0_2_ = -(ushort)(sVar53 < local_178);
        auVar48._2_2_ = -(ushort)(sVar54 < sStack_176);
        auVar48._4_2_ = -(ushort)(sVar55 < local_178);
        auVar48._6_2_ = -(ushort)(sVar56 < sStack_176);
        auVar48._8_2_ = -(ushort)(sVar57 < local_178);
        auVar48._10_2_ = -(ushort)(sVar58 < sStack_176);
        auVar48._12_2_ = -(ushort)(sVar59 < local_178);
        auVar48._14_2_ = -(ushort)(sVar60 < sStack_176);
        auVar68._0_2_ = -(ushort)(local_f8 < sVar69);
        auVar68._2_2_ = -(ushort)(sStack_f6 < sVar61);
        auVar68._4_2_ = -(ushort)(sStack_f4 < sVar64);
        auVar68._6_2_ = -(ushort)(sStack_f2 < sVar71);
        auVar68._8_2_ = -(ushort)(sStack_f0 < sVar72);
        auVar68._10_2_ = -(ushort)(sStack_ee < sVar73);
        auVar68._12_2_ = -(ushort)(sStack_ec < sVar74);
        auVar68._14_2_ = -(ushort)(sStack_ea < sVar75);
        auVar68 = auVar68 | auVar48;
        if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar68 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar68 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar68 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar68 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar68 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar68 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar68 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar68 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar68[0xf] < '\0') {
          *(byte *)&local_110->flag = (byte)local_110->flag | 0x40;
          sVar34 = 0;
          iVar21 = 0;
          iVar18 = 0;
        }
        local_110->score = (int)sVar34;
        local_110->end_query = iVar18;
        local_110->end_ref = iVar21;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar19;
        }
        return ppVar19;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}